

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t validate_image_dimensions(exr_context_t f,exr_priv_part_t curpart)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  exr_result_t eVar9;
  long lVar10;
  long lVar11;
  long in_RSI;
  long in_RDI;
  int64_t ccount;
  int64_t maxNum;
  int maxh;
  int maxw;
  float sww;
  float par;
  int64_t h;
  int64_t w;
  exr_attr_box2i_t dspw;
  exr_attr_box2i_t dw;
  int64_t kLargeVal;
  long local_70;
  int local_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int local_30;
  int iStack_2c;
  int local_28;
  int iStack_24;
  exr_result_t local_4;
  
  uVar5 = *(ulong *)(in_RSI + 0x90);
  uVar6 = *(ulong *)(in_RSI + 0x98);
  uVar7 = *(ulong *)(in_RSI + 0xa0);
  uVar8 = *(ulong *)(in_RSI + 0xa8);
  iVar3 = *(int *)(in_RDI + 0x68);
  iVar4 = *(int *)(in_RDI + 0x6c);
  fVar1 = *(float *)(*(long *)(in_RSI + 0x48) + 0x18);
  fVar2 = *(float *)(*(long *)(in_RSI + 0x58) + 0x18);
  local_28 = (int)uVar6;
  local_30 = (int)uVar5;
  lVar10 = ((long)local_28 - (long)local_30) + 1;
  iStack_24 = (int)(uVar6 >> 0x20);
  iStack_2c = (int)(uVar5 >> 0x20);
  lVar11 = ((long)iStack_24 - (long)iStack_2c) + 1;
  local_40 = (int)uVar7;
  local_38 = (int)uVar8;
  iStack_3c = (int)(uVar7 >> 0x20);
  iStack_34 = (int)(uVar8 >> 0x20);
  if ((((local_38 < local_40) || (iStack_34 < iStack_3c)) || (local_40 < -0x3ffffffe)) ||
     (((iStack_3c < -0x3ffffffe || (0x3ffffffe < local_38)) || (0x3ffffffe < iStack_34)))) {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Invalid display window (%d, %d - %d, %d)",uVar7 & 0xffffffff,
                         iStack_3c,uVar8 & 0xffffffff,iStack_34);
  }
  else if (((local_28 < local_30) || (iStack_24 < iStack_2c)) ||
          ((local_30 < -0x3ffffffe ||
           (((iStack_2c < -0x3ffffffe || (0x3ffffffe < local_28)) || (0x3ffffffe < iStack_24)))))) {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Invalid data window (%d, %d - %d, %d)",uVar5 & 0xffffffff,
                         iStack_2c,uVar6 & 0xffffffff,iStack_24);
  }
  else if ((iVar3 < 1) || (lVar10 <= iVar3)) {
    if ((iVar4 < 1) || (lVar11 <= iVar4)) {
      if ((0 < iVar3) && (0 < iVar4)) {
        local_70 = 0;
        if (*(long *)(in_RSI + 0x80) != 0) {
          local_70 = (long)*(int *)(in_RSI + 0xf4);
        }
        if ((long)iVar3 * (long)iVar4 < local_70) {
          eVar9 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,"Invalid chunkCount (%ld) exceeds maximum area of %ld",
                             local_70,(long)iVar3 * (long)iVar4);
          return eVar9;
        }
      }
      if (((0x7effffff < (int)ABS(fVar1) - 0x800000U) || (fVar1 < 1e-06)) || (1e+06 < fVar1)) {
        local_4 = (**(code **)(in_RDI + 0x48))
                            (SUB84((double)fVar1,0),in_RDI,0xe,"Invalid pixel aspect ratio %g");
      }
      else if (0.0 <= fVar2) {
        local_4 = 0;
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x48))
                            (SUB84((double)fVar2,0),in_RDI,0xe,"Invalid screen window width %g");
      }
    }
    else {
      local_4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,"Invalid height (%ld) too large (max %d)",lVar11,iVar4);
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Invalid width (%ld) too large (max %d)",lVar10,iVar3);
  }
  return local_4;
}

Assistant:

static exr_result_t
validate_image_dimensions (exr_context_t f, exr_priv_part_t curpart)
{
    // sanity check the various parts...
    const int64_t          kLargeVal = (int64_t) (INT32_MAX / 2);
    const exr_attr_box2i_t dw        = curpart->data_window;
    const exr_attr_box2i_t dspw      = curpart->display_window;
    int64_t                w, h;
    float                  par, sww;
    int                    maxw = f->max_image_w;
    int                    maxh = f->max_image_h;

    par = curpart->pixelAspectRatio->f;
    sww = curpart->screenWindowWidth->f;

    w = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    if (dspw.min.x > dspw.max.x || dspw.min.y > dspw.max.y ||
        dspw.min.x <= -kLargeVal || dspw.min.y <= -kLargeVal ||
        dspw.max.x >= kLargeVal || dspw.max.y >= kLargeVal)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid display window (%d, %d - %d, %d)",
            dspw.min.x,
            dspw.min.y,
            dspw.max.x,
            dspw.max.y);

    if (dw.min.x > dw.max.x || dw.min.y > dw.max.y || dw.min.x <= -kLargeVal ||
        dw.min.y <= -kLargeVal || dw.max.x >= kLargeVal ||
        dw.max.y >= kLargeVal)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid data window (%d, %d - %d, %d)",
            dw.min.x,
            dw.min.y,
            dw.max.x,
            dw.max.y);

    if (maxw > 0 && maxw < w)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid width (%" PRId64 ") too large (max %d)",
            w,
            maxw);

    if (maxh > 0 && maxh < h)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid height (%" PRId64 ") too large (max %d)",
            h,
            maxh);

    if (maxw > 0 && maxh > 0)
    {
        int64_t maxNum = (int64_t) maxw * (int64_t) maxh;
        int64_t ccount = 0;
        if (curpart->chunkCount) ccount = (int64_t) curpart->chunk_count;
        if (ccount > maxNum)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunkCount (%" PRId64
                ") exceeds maximum area of %" PRId64 "",
                ccount,
                maxNum);
    }

    /* isnormal will return true when par is 0, which should also be disallowed */
    if (!isnormal (par) || par < 1e-6f || par > 1e+6f)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid pixel aspect ratio %g",
            (double) par);

    if (sww < 0.f)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid screen window width %g",
            (double) sww);

    return EXR_ERR_SUCCESS;
}